

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImGuiTextBuffer::reserve(ImGuiTextBuffer *this,int capacity)

{
  int *piVar1;
  char *pcVar2;
  char *__dest;
  
  if ((this->Buf).Capacity < capacity) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (char *)(*GImAllocatorAllocFunc)((long)capacity,GImAllocatorUserData);
    pcVar2 = (this->Buf).Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(__dest,pcVar2,(long)(this->Buf).Size);
      pcVar2 = (this->Buf).Data;
      if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    }
    (this->Buf).Data = __dest;
    (this->Buf).Capacity = capacity;
  }
  return;
}

Assistant:

inline void         reserve(int new_capacity)           { if (new_capacity <= Capacity) return; T* new_data = (T*)IM_ALLOC((size_t)new_capacity * sizeof(T)); if (Data) { memcpy(new_data, Data, (size_t)Size * sizeof(T)); IM_FREE(Data); } Data = new_data; Capacity = new_capacity; }